

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scan.hpp
# Opt level: O0

Task __thiscall
tf::FlowBuilder::
exclusive_scan<std::reference_wrapper<__gnu_cxx::__normal_iterator<std::__cxx11::string*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>>,std::reference_wrapper<__gnu_cxx::__normal_iterator<std::__cxx11::string*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>>,std::reference_wrapper<__gnu_cxx::__normal_iterator<std::__cxx11::string*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>>,std::__cxx11::string,std::plus<std::__cxx11::string>>
          (void *param_1,undefined8 param_2,undefined8 param_3,undefined8 param_4,undefined8 param_5
          ,string *param_6)

{
  anon_class_64_5_1a9029b9_conflict *in_stack_ffffffffffffff50;
  FlowBuilder *in_stack_ffffffffffffff58;
  undefined1 local_78 [64];
  string *local_38;
  undefined8 local_30;
  undefined8 local_20;
  undefined8 local_18;
  undefined8 local_10;
  void *local_8;
  
  local_38 = param_6;
  local_30 = param_2;
  local_20 = param_5;
  local_18 = param_4;
  local_10 = param_3;
  local_8 = param_1;
  std::__cxx11::string::string((string *)&stack0xffffffffffffff50,param_6);
  make_exclusive_scan_task<std::reference_wrapper<__gnu_cxx::__normal_iterator<std::__cxx11::string*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>>,std::reference_wrapper<__gnu_cxx::__normal_iterator<std::__cxx11::string*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>>,std::reference_wrapper<__gnu_cxx::__normal_iterator<std::__cxx11::string*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>>,std::__cxx11::string,std::plus<std::__cxx11::string>>
            (local_78,param_3,param_4,param_5,(string *)&stack0xffffffffffffff50);
  emplace<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_taskflow_algorithm_scan_hpp:431:10),_nullptr>
            (in_stack_ffffffffffffff58,in_stack_ffffffffffffff50);
  make_exclusive_scan_task<std::reference_wrapper<__gnu_cxx::__normal_iterator<std::__cxx11::string*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>>,std::reference_wrapper<__gnu_cxx::__normal_iterator<std::__cxx11::string*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>>,std::reference_wrapper<__gnu_cxx::__normal_iterator<std::__cxx11::string*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>>,std::__cxx11::string,std::plus<std::__cxx11::string>>(std::reference_wrapper<__gnu_cxx::__normal_iterator<std::__cxx11::string*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>>,std::reference_wrapper<__gnu_cxx::__normal_iterator<std::__cxx11::string*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>>,std::reference_wrapper<__gnu_cxx::__normal_iterator<std::__cxx11::string*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>>,std::__cxx11::string,std::plus<std::__cxx11::string>)
  ::{lambda(tf::Subflow&)#1}::~Subflow((anon_class_64_5_1a9029b9_conflict *)0x18576d);
  std::__cxx11::string::~string((string *)&stack0xffffffffffffff50);
  return (Task)(Node *)param_1;
}

Assistant:

Task FlowBuilder::exclusive_scan(B first, E last, D d_first, T init, BOP bop) {
  return emplace(make_exclusive_scan_task(first, last, d_first, init, bop));
}